

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O0

void Gia_ManInseSimulateObj(Gia_Man_t *p,int Id)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  word *pwVar4;
  word wVar5;
  word *pwVar6;
  int local_54;
  int Id2;
  int i;
  word *pDataB1;
  word *pDataA1;
  word *pData1;
  word *pDataB0;
  word *pDataA0;
  word *pData0;
  Gia_Obj_t *pObj;
  int Id_local;
  Gia_Man_t *p_local;
  
  pGVar3 = Gia_ManObj(p,Id);
  iVar1 = Gia_ObjIsAnd(pGVar3);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsCo(pGVar3);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGVar3);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsConst0(pGVar3);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                        ,0x9f,"void Gia_ManInseSimulateObj(Gia_Man_t *, int)");
        }
        pwVar4 = Gia_ParTestObj(p,Id);
        iVar1 = p->iData;
        for (local_54 = 0; local_54 < p->iData; local_54 = local_54 + 1) {
          pwVar4[local_54] = 0xffffffffffffffff;
          pwVar4[(long)iVar1 + (long)local_54] = 0;
        }
      }
      else {
        iVar1 = Gia_ObjIsPi(p,pGVar3);
        if (iVar1 == 0) {
          pGVar3 = Gia_ObjRoToRi(p,pGVar3);
          iVar2 = Gia_ObjId(p,pGVar3);
          pwVar4 = Gia_ParTestObj(p,Id);
          iVar1 = p->iData;
          pwVar6 = Gia_ParTestObj(p,iVar2);
          iVar2 = p->iData;
          for (local_54 = 0; local_54 < p->iData; local_54 = local_54 + 1) {
            pwVar4[local_54] = pwVar6[local_54];
            pwVar4[(long)iVar1 + (long)local_54] = pwVar6[(long)iVar2 + (long)local_54];
          }
        }
        else {
          pwVar4 = Gia_ParTestObj(p,Id);
          iVar1 = p->iData;
          for (local_54 = 0; local_54 < p->iData; local_54 = local_54 + 1) {
            wVar5 = Gia_ManRandomW(0);
            pwVar4[local_54] = wVar5;
            pwVar4[(long)iVar1 + (long)local_54] = pwVar4[local_54] ^ 0xffffffffffffffff;
          }
        }
      }
    }
    else {
      pwVar4 = Gia_ParTestObj(p,Id);
      iVar1 = p->iData;
      iVar2 = Gia_ObjFaninC0(pGVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFaninId0(pGVar3,Id);
        pDataB0 = Gia_ParTestObj(p,iVar2);
        pDataB1 = pDataB0 + p->iData;
      }
      else {
        iVar2 = Gia_ObjFaninId0(pGVar3,Id);
        pDataB1 = Gia_ParTestObj(p,iVar2);
        pDataB0 = pDataB1 + p->iData;
      }
      for (local_54 = 0; local_54 < p->iData; local_54 = local_54 + 1) {
        pwVar4[local_54] = pDataB0[local_54];
        pwVar4[(long)iVar1 + (long)local_54] = pDataB1[local_54];
      }
    }
  }
  else {
    pwVar4 = Gia_ParTestObj(p,Id);
    iVar1 = p->iData;
    iVar2 = Gia_ObjFaninC0(pGVar3);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninId0(pGVar3,Id);
      pDataB0 = Gia_ParTestObj(p,iVar2);
      pDataB1 = pDataB0 + p->iData;
      iVar2 = Gia_ObjFaninC1(pGVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFaninId1(pGVar3,Id);
        pData1 = Gia_ParTestObj(p,iVar2);
        _Id2 = pData1 + p->iData;
      }
      else {
        iVar2 = Gia_ObjFaninId1(pGVar3,Id);
        _Id2 = Gia_ParTestObj(p,iVar2);
        pData1 = _Id2 + p->iData;
      }
    }
    else {
      iVar2 = Gia_ObjFaninId0(pGVar3,Id);
      pDataB1 = Gia_ParTestObj(p,iVar2);
      pDataB0 = pDataB1 + p->iData;
      iVar2 = Gia_ObjFaninC1(pGVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFaninId1(pGVar3,Id);
        pData1 = Gia_ParTestObj(p,iVar2);
        _Id2 = pData1 + p->iData;
      }
      else {
        iVar2 = Gia_ObjFaninId1(pGVar3,Id);
        _Id2 = Gia_ParTestObj(p,iVar2);
        pData1 = _Id2 + p->iData;
      }
    }
    for (local_54 = 0; local_54 < p->iData; local_54 = local_54 + 1) {
      pwVar4[local_54] = pDataB0[local_54] | pData1[local_54];
      pwVar4[(long)iVar1 + (long)local_54] = pDataB1[local_54] & _Id2[local_54];
    }
  }
  return;
}

Assistant:

void Gia_ManInseSimulateObj( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    word * pData0, * pDataA0, * pDataB0;
    word * pData1, * pDataA1, * pDataB1;
    int i;
    if ( Gia_ObjIsAnd(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i] | pDataB0[i], pData1[i] = pDataA1[i] & pDataB1[i];
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p, pObj) )
        {
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = Gia_ManRandomW(0), pData1[i] = ~pData0[i];
        }
        else
        {
            int Id2 = Gia_ObjId(p, Gia_ObjRoToRi(p, pObj));
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            pDataA0 = Gia_ParTestObj( p, Id2 );
            pDataA1 = pDataA0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = ~(word)0, pData1[i] = 0;
    }
    else assert( 0 );
}